

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O2

RefData * __thiscall BamTools::RefData::operator=(RefData *this,RefData *param_1)

{
  std::__cxx11::string::_M_assign((string *)this);
  this->RefLength = param_1->RefLength;
  return this;
}

Assistant:

struct API_EXPORT RefData {
   
    std::string RefName;    //!< name of reference sequence
    int32_t     RefLength;  //!< length of reference sequence
    
    //! constructor
    RefData(const std::string& name = "",
            const int32_t& length = 0)
        : RefName(name)
        , RefLength(length)
    { }
}